

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

_Bool Curl_expire_clear(Curl_easy *data)

{
  Curl_multi *pCVar1;
  uint uVar2;
  curltime *pcVar3;
  int rc;
  Curl_llist *list;
  curltime *nowp;
  Curl_multi *multi;
  Curl_easy *data_local;
  
  pCVar1 = data->multi;
  pcVar3 = &(data->state).expiretime;
  if (pCVar1 == (Curl_multi *)0x0) {
    data_local._7_1_ = false;
  }
  else if ((pcVar3->tv_sec == 0) && ((data->state).expiretime.tv_usec == 0)) {
    data_local._7_1_ = false;
  }
  else {
    uVar2 = Curl_splayremove(pCVar1->timetree,&(data->state).timenode,&pCVar1->timetree);
    if (((uVar2 != 0) &&
        ((data != (Curl_easy *)0x0 && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)))) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Internal error clearing splay node = %d",(ulong)uVar2);
    }
    Curl_llist_destroy(&(data->state).timeoutlist,(void *)0x0);
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_multi.log_level)) {
      Curl_trc_multi(data,"Expire cleared");
    }
    pcVar3->tv_sec = 0;
    (data->state).expiretime.tv_usec = 0;
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

bool Curl_expire_clear(struct Curl_easy *data)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *nowp = &data->state.expiretime;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return FALSE;

  if(nowp->tv_sec || nowp->tv_usec) {
    /* Since this is an cleared time, we must remove the previous entry from
       the splay tree */
    struct Curl_llist *list = &data->state.timeoutlist;
    int rc;

    rc = Curl_splayremove(multi->timetree, &data->state.timenode,
                          &multi->timetree);
    if(rc)
      infof(data, "Internal error clearing splay node = %d", rc);

    /* clear the timeout list too */
    Curl_llist_destroy(list, NULL);

    CURL_TRC_M(data, "Expire cleared");
    nowp->tv_sec = 0;
    nowp->tv_usec = 0;
    return TRUE;
  }
  return FALSE;
}